

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::addTimer(EventLoop *this,int id,long timeout,Functor *cb)

{
  Functor *timeout_ms;
  int id_00;
  element_type *this_00;
  function<void_()> local_48;
  Functor *local_28;
  Functor *cb_local;
  long timeout_local;
  EventLoop *pEStack_10;
  int id_local;
  EventLoop *this_local;
  
  local_28 = cb;
  cb_local = (Functor *)timeout;
  timeout_local._4_4_ = id;
  pEStack_10 = this;
  this_00 = std::__shared_ptr_access<TimerHeap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<TimerHeap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->timer_);
  id_00 = timeout_local._4_4_;
  timeout_ms = cb_local;
  std::function<void_()>::function(&local_48,cb);
  TimerHeap::addTimer(this_00,id_00,(long)timeout_ms,&local_48);
  std::function<void_()>::~function(&local_48);
  return;
}

Assistant:

void EventLoop::addTimer(int id, long timeout, Functor cb) {
//    queueInLoop(std::bind(&TimerHeap::addTimer, timer_, connfd, timeout, std::move(cb)));
    timer_->addTimer(id, timeout, std::move(cb));
}